

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::fwrite_all(void *ptr,size_t count,FILE *stream)

{
  format_string<> fmt;
  size_t sVar1;
  undefined8 uVar2;
  FILE *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  size_t written;
  int ignore;
  string_view sv;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff70;
  undefined1 local_61;
  basic_string_view<char> local_60;
  int error_code;
  int local_2c;
  char *local_28;
  undefined8 local_20;
  undefined1 *local_10;
  basic_string_view<char> *local_8;
  
  sVar1 = fwrite(in_RDI,1,in_RSI,in_RDX);
  if (sVar1 < in_RSI) {
    uVar2 = __cxa_allocate_exception(0x20);
    error_code = (int)(sVar1 >> 0x20);
    __errno_location();
    fwrite_all::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffff70);
    local_8 = &local_60;
    local_10 = &local_61;
    local_60 = v11::operator()((FMT_COMPILE_STRING *)0x646a0e);
    local_28 = "cannot write to file";
    local_20 = 0x14;
    local_2c = 0;
    ignore_unused<int>(&local_2c);
    fmt.str.size_ = in_RSI;
    fmt.str.data_ = (char *)in_RDX;
    system_error<>(error_code,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_all(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}